

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

void qpdf_oh_begin_dict_key_iter(qpdf_data qpdf,qpdf_oh oh)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  string *psVar3;
  undefined1 this [8];
  size_type sVar4;
  uint uVar5;
  _Node *p_Var6;
  char *cstr;
  Pipeline *this_00;
  Pipeline **ppPVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret;
  undefined1 local_190 [8];
  undefined1 local_188 [24];
  _Invoker_type p_Stack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  int local_104;
  _Any_data local_100;
  code *local_f0;
  undefined8 uStack_e8;
  qpdf_oh local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  Pipeline local_58;
  
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1408:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1408:9)>
             ::_M_manager;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1409:9)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1409:9)>
              ::_M_manager;
  std::
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_()>
  ::function((function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_()>
              *)&local_98,
             (function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_()>
              *)&local_78);
  std::
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&)>
  ::function((function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&)>
              *)&local_100,
             (function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&)>
              *)&local_128);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_e0 = oh;
  local_d8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_d8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x18) = uStack_e8;
  if (local_f0 != (code *)0x0) {
    *(void **)local_d8._M_unused._0_8_ = local_100._M_unused._M_object;
    *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = local_100._8_8_;
    *(code **)((long)local_d8._M_unused._0_8_ + 0x10) = local_f0;
    local_f0 = (code *)0x0;
    uStack_e8 = 0;
  }
  *(qpdf_oh *)((long)local_d8._M_unused._0_8_ + 0x20) = oh;
  pcStack_c0 = std::
               _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  psVar3 = &local_58.identifier;
  local_58.identifier._M_dataplus._M_p._0_4_ = _S_red;
  local_58.identifier._M_string_length = 0;
  local_58.next_ = (Pipeline *)0x0;
  local_190 = (undefined1  [8])&local_58;
  local_58.identifier.field_2._M_allocated_capacity = (size_type)psVar3;
  local_58.identifier.field_2._8_8_ = psVar3;
  std::
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
  ::function((function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
              *)local_188,
             (function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
              *)&local_d8);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_b8._M_unused._0_8_ = local_190;
  *(long *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_b8._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_b8._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_b8._M_unused._0_8_ + 0x20) = p_Stack_170;
  if ((_Manager_type)local_188._16_8_ != (_Manager_type)0x0) {
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = local_188._0_8_;
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x10) = local_188._8_8_;
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x18) = local_188._16_8_;
    local_188._16_8_ = (_Manager_type)0x0;
    p_Stack_170 = (_Invoker_type)0x0;
  }
  pcStack_a0 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar5 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((_Manager_type)local_188._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_188._16_8_)
              ((function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
                *)local_188,
               (function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
                *)local_188,3);
  }
  sVar4 = local_58.identifier._M_string_length;
  p_Var2 = &local_158._M_impl.super__Rb_tree_header;
  if (uVar5 < 2) {
    if ((_Base_ptr)local_58.identifier._M_string_length == (_Base_ptr)0x0) {
      local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ppPVar7 = (Pipeline **)&local_158._M_impl.super__Rb_tree_header._M_node_count;
      local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    else {
      ppPVar7 = &local_58.next_;
      *(_Rb_tree_header **)(local_58.identifier._M_string_length + 8) = p_Var2;
      local_158._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_58.next_;
      local_58.identifier._M_string_length = 0;
      local_158._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_58.identifier.field_2._M_allocated_capacity;
      local_158._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)local_58.identifier.field_2._8_8_;
      local_158._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)local_58.identifier._M_dataplus._M_p;
      local_58.identifier.field_2._M_allocated_capacity = (size_type)psVar3;
      local_58.identifier.field_2._8_8_ = psVar3;
    }
    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)sVar4;
    *ppPVar7 = (Pipeline *)0x0;
  }
  else {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_168._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_190,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_104 = 0;
        p_Var6 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,
                            (qpdf_error_code_e *)&local_168._M_allocated_capacity,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_190,(char (*) [1])0x27f708,&local_104,
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        psVar1 = &(qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_190 != (undefined1  [8])(local_188 + 8)) {
          operator_delete((void *)local_190,local_188._8_8_ + 1);
        }
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_190,SUB41(local_168._M_allocated_capacity._0_4_,0));
      this = local_190;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
      }
    }
    if (local_88 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_80)((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_158,&local_98);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(qpdf->cur_iter_dict_keys)._M_t);
  if (local_158._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_158._M_impl.super__Rb_tree_header._M_header._M_color;
    (qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
    (qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
    (qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_158._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_158._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    (qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_158._M_impl.super__Rb_tree_header._M_node_count;
    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_158);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  (qpdf->dict_iter)._M_node =
       (qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void
qpdf_oh_begin_dict_key_iter(qpdf_data qpdf, qpdf_oh oh)
{
    qpdf->cur_iter_dict_keys = do_with_oh<std::set<std::string>>(
        qpdf,
        oh,
        []() { return std::set<std::string>(); },
        [](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_begin_dict_key_iter");
            return o.getKeys();
        });
    qpdf->dict_iter = qpdf->cur_iter_dict_keys.begin();
}